

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

void mtbdd_refs_ptrs_up(mtbdd_refs_internal_t mtbdd_refs_key)

{
  MTBDD **ppMVar1;
  MTBDD **__ptr;
  MTBDD **ppMVar2;
  long lVar3;
  
  ppMVar1 = mtbdd_refs_key->pcur;
  __ptr = mtbdd_refs_key->pbegin;
  lVar3 = (long)mtbdd_refs_key->pend - (long)__ptr;
  ppMVar2 = (MTBDD **)realloc(__ptr,lVar3 * 2);
  mtbdd_refs_key->pbegin = ppMVar2;
  mtbdd_refs_key->pcur = (MTBDD **)(((long)ppMVar1 - (long)__ptr) + (long)ppMVar2);
  mtbdd_refs_key->pend = (MTBDD **)((long)ppMVar2 + lVar3 * 2);
  return;
}

Assistant:

void
mtbdd_refs_ptrs_up(mtbdd_refs_internal_t mtbdd_refs_key)
{
    size_t cur = mtbdd_refs_key->pcur - mtbdd_refs_key->pbegin;
    size_t size = mtbdd_refs_key->pend - mtbdd_refs_key->pbegin;
    mtbdd_refs_key->pbegin = (const MTBDD**)realloc(mtbdd_refs_key->pbegin, sizeof(MTBDD*) * size * 2);
    mtbdd_refs_key->pcur = mtbdd_refs_key->pbegin + cur;
    mtbdd_refs_key->pend = mtbdd_refs_key->pbegin + (size * 2);
}